

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopDescriptor::RemoveLoop(LoopDescriptor *this,Loop *loop)

{
  Loop **ppLVar1;
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  *this_00;
  key_type_conflict kVar2;
  Loop *pLVar3;
  mapped_type pLVar4;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  _Var5;
  Loop **ppLVar6;
  const_iterator cVar7;
  Loop *pLVar8;
  mapped_type *ppLVar9;
  pointer ppLVar10;
  pointer ppLVar11;
  _Hash_node_base *p_Var12;
  key_type_conflict local_3c;
  Loop *local_38;
  
  pLVar8 = &this->placeholder_top_loop_;
  if (loop->parent_ != (Loop *)0x0) {
    pLVar8 = loop->parent_;
  }
  local_38 = loop;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((pLVar8->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pLVar8->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  ppLVar1 = _Var5._M_current + 1;
  ppLVar6 = (pLVar8->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 != ppLVar6) {
    memmove(_Var5._M_current,ppLVar1,(long)ppLVar6 - (long)ppLVar1);
    ppLVar6 = (pLVar8->nested_loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppLVar6 = ppLVar6 + -1;
  (pLVar8->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppLVar6;
  ppLVar11 = (local_38->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (local_38->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar11 != ppLVar10) {
    pLVar3 = local_38->parent_;
    do {
      (*ppLVar11)->parent_ = pLVar3;
      ppLVar11 = ppLVar11 + 1;
    } while (ppLVar11 != ppLVar10);
    ppLVar6 = (pLVar8->nested_loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppLVar11 = (local_38->nested_loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppLVar10 = (local_38->nested_loops_).
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>
            ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
             &pLVar8->nested_loops_,ppLVar6,ppLVar11,ppLVar10);
  p_Var12 = (local_38->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var12 != (_Hash_node_base *)0x0) {
    this_00 = &this->basic_block_to_loop_;
    do {
      kVar2 = *(key_type_conflict *)&p_Var12[1]._M_nxt;
      local_3c = kVar2;
      cVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_3c);
      if (cVar7.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pLVar8 = (Loop *)0x0;
      }
      else {
        pLVar8 = *(Loop **)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                  ._M_cur + 0x10);
      }
      if (pLVar8 == local_38) {
        pLVar4 = pLVar8->parent_;
        local_3c = kVar2;
        ppLVar9 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&local_3c);
        *ppLVar9 = pLVar4;
      }
      else {
        local_3c = kVar2;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&this_00->_M_h,&local_3c);
      }
      p_Var12 = p_Var12->_M_nxt;
    } while (p_Var12 != (_Hash_node_base *)0x0);
  }
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                    ((this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  pLVar8 = local_38;
  if (_Var5._M_current !=
      (this->loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_38 != (Loop *)0x0) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&(local_38->loop_basic_blocks_)._M_h);
      ppLVar11 = (pLVar8->nested_loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppLVar11 != (pointer)0x0) {
        operator_delete(ppLVar11,(long)(pLVar8->nested_loops_).
                                       super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppLVar11);
      }
    }
    operator_delete(pLVar8,0x90);
    ppLVar1 = _Var5._M_current + 1;
    ppLVar6 = (this->loops_).
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar1 != ppLVar6) {
      memmove(_Var5._M_current,ppLVar1,(long)ppLVar6 - (long)ppLVar1);
      ppLVar6 = (this->loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    (this->loops_).super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppLVar6 + -1;
    return;
  }
  __assert_fail("it != loops_.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x3fa,"void spvtools::opt::LoopDescriptor::RemoveLoop(Loop *)");
}

Assistant:

void LoopDescriptor::RemoveLoop(Loop* loop) {
  Loop* parent = loop->GetParent() ? loop->GetParent() : &placeholder_top_loop_;
  parent->nested_loops_.erase(std::find(parent->nested_loops_.begin(),
                                        parent->nested_loops_.end(), loop));
  std::for_each(
      loop->nested_loops_.begin(), loop->nested_loops_.end(),
      [loop](Loop* sub_loop) { sub_loop->SetParent(loop->GetParent()); });
  parent->nested_loops_.insert(parent->nested_loops_.end(),
                               loop->nested_loops_.begin(),
                               loop->nested_loops_.end());
  for (uint32_t bb_id : loop->GetBlocks()) {
    Loop* l = FindLoopForBasicBlock(bb_id);
    if (l == loop) {
      SetBasicBlockToLoop(bb_id, l->GetParent());
    } else {
      ForgetBasicBlock(bb_id);
    }
  }

  LoopContainerType::iterator it =
      std::find(loops_.begin(), loops_.end(), loop);
  assert(it != loops_.end());
  delete loop;
  loops_.erase(it);
}